

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

cupdlp_int csc_clear(CUPDLPcsc *csc)

{
  if (csc != (CUPDLPcsc *)0x0) {
    if (csc->colMatBeg != (cupdlp_int *)0x0) {
      free(csc->colMatBeg);
      csc->colMatBeg = (cupdlp_int *)0x0;
    }
    if (csc->colMatIdx != (cupdlp_int *)0x0) {
      free(csc->colMatIdx);
      csc->colMatIdx = (cupdlp_int *)0x0;
    }
    free(csc->colMatElem);
    free(csc);
  }
  return 0;
}

Assistant:

cupdlp_int csc_clear(CUPDLPcsc *csc) {
  if (csc) {
#ifndef CUPDLP_CPU
    if (csc->cuda_csc != NULL) {
      CHECK_CUSPARSE(cusparseDestroySpMat(csc->cuda_csc))
    }
#endif
    if (csc->colMatBeg) {
      CUPDLP_FREE_VEC(csc->colMatBeg);
    }
    if (csc->colMatIdx) {
      CUPDLP_FREE_VEC(csc->colMatIdx);
    }
    if (csc->colMatElem) {
      CUPDLP_FREE_VEC(csc->colMatElem);
    }
      cupdlp_free(csc);
  }
  return 0;
}